

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int idaLsPSetup(void *ida_mem)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_18;
  IDAMem local_10;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"idaLsPSetup",&local_10,&local_18);
  if (iVar1 == 0) {
    iVar1 = (*local_18->pset)(local_10->ida_tn,local_18->ycur,local_18->ypcur,local_18->rcur,
                              local_10->ida_cj,local_18->pdata);
    local_18->npe = local_18->npe + 1;
  }
  return iVar1;
}

Assistant:

int idaLsPSetup(void* ida_mem)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* Call user pset routine to update preconditioner and possibly
     reset jcur (pass !jbad as update suggestion) */
  retval = idals_mem->pset(IDA_mem->ida_tn, idals_mem->ycur, idals_mem->ypcur,
                           idals_mem->rcur, IDA_mem->ida_cj, idals_mem->pdata);
  idals_mem->npe++;
  return (retval);
}